

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoordCubeArray
               (vector<float,_std::allocator<float>_> *dst,CubeFace face,Vec2 *bottomLeft,
               Vec2 *topRight,Vec2 *layerRange)

{
  reference pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float l1;
  float l0;
  float mSign;
  float tSign;
  float sSign;
  int qRow;
  int mRow;
  int tRow;
  int sRow;
  Vec2 *layerRange_local;
  Vec2 *topRight_local;
  Vec2 *bottomLeft_local;
  CubeFace face_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  mSign = 1.0;
  l0 = 1.0;
  l1 = 1.0;
  fVar2 = tcu::Vector<float,_2>::x(layerRange);
  fVar3 = tcu::Vector<float,_2>::y(layerRange);
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    sSign = 0.0;
    mRow = 2;
    qRow = 1;
    l1 = -1.0;
    l0 = -1.0;
    break;
  case CUBEFACE_POSITIVE_X:
    sSign = 0.0;
    mRow = 2;
    qRow = 1;
    mSign = -1.0;
    l0 = -1.0;
    break;
  case CUBEFACE_NEGATIVE_Y:
    sSign = 1.4013e-45;
    mRow = 0;
    qRow = 2;
    l1 = -1.0;
    l0 = -1.0;
    break;
  case CUBEFACE_POSITIVE_Y:
    sSign = 1.4013e-45;
    mRow = 0;
    qRow = 2;
    break;
  case CUBEFACE_NEGATIVE_Z:
    sSign = 2.8026e-45;
    mRow = 0;
    qRow = 1;
    l1 = -1.0;
    mSign = -1.0;
    l0 = -1.0;
    break;
  case CUBEFACE_POSITIVE_Z:
    sSign = 2.8026e-45;
    mRow = 0;
    qRow = 1;
    l0 = -1.0;
    break;
  default:
    goto switchD_00d4703e_default;
  }
  std::vector<float,_std::allocator<float>_>::resize(dst,0x10);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(int)sSign);
  *pvVar1 = l1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)sSign + 4));
  *pvVar1 = l1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)sSign + 8));
  *pvVar1 = l1;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)sSign + 0xc));
  *pvVar1 = l1;
  fVar4 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)mRow);
  *pvVar1 = mSign * fVar4;
  fVar4 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(mRow + 4));
  *pvVar1 = mSign * fVar4;
  fVar4 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(mRow + 8));
  *pvVar1 = mSign * fVar4;
  fVar4 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(mRow + 0xc));
  *pvVar1 = mSign * fVar4;
  fVar4 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)qRow);
  *pvVar1 = l0 * fVar4;
  fVar4 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(qRow + 4));
  *pvVar1 = l0 * fVar4;
  fVar4 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(qRow + 8));
  *pvVar1 = l0 * fVar4;
  fVar4 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(qRow + 0xc));
  *pvVar1 = l0 * fVar4;
  if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
    *pvVar1 = fVar2;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
    *pvVar1 = fVar2 * 0.5 + fVar3 * 0.5;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xb);
    *pvVar1 = fVar2 * 0.5 + fVar3 * 0.5;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xf);
    *pvVar1 = fVar3;
  }
  else {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
    *pvVar1 = fVar2;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
    *pvVar1 = fVar2;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xb);
    *pvVar1 = fVar2;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xf);
    *pvVar1 = fVar2;
  }
switchD_00d4703e_default:
  return;
}

Assistant:

void computeQuadTexCoordCubeArray (std::vector<float>& dst, tcu::CubeFace face, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight, const tcu::Vec2& layerRange)
{
	int			sRow	= 0;
	int			tRow	= 0;
	int			mRow	= 0;
	const int	qRow	= 3;
	float		sSign	= 1.0f;
	float		tSign	= 1.0f;
	float		mSign	= 1.0f;
	const float	l0		= layerRange.x();
	const float	l1		= layerRange.y();

	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: mRow = 0; sRow = 2; tRow = 1; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_X: mRow = 0; sRow = 2; tRow = 1;				sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_NEGATIVE_Y: mRow = 1; sRow = 0; tRow = 2; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Y: mRow = 1; sRow = 0; tRow = 2;												break;
		case tcu::CUBEFACE_NEGATIVE_Z: mRow = 2; sRow = 0; tRow = 1; mSign = -1.0f; sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Z: mRow = 2; sRow = 0; tRow = 1;							   tSign = -1.0f;	break;
		default:
			DE_ASSERT(DE_FALSE);
			return;
	}

	dst.resize(4*4);

	dst[ 0+mRow] = mSign;
	dst[ 4+mRow] = mSign;
	dst[ 8+mRow] = mSign;
	dst[12+mRow] = mSign;

	dst[ 0+sRow] = sSign * bottomLeft.x();
	dst[ 4+sRow] = sSign * bottomLeft.x();
	dst[ 8+sRow] = sSign * topRight.x();
	dst[12+sRow] = sSign * topRight.x();

	dst[ 0+tRow] = tSign * bottomLeft.y();
	dst[ 4+tRow] = tSign * topRight.y();
	dst[ 8+tRow] = tSign * bottomLeft.y();
	dst[12+tRow] = tSign * topRight.y();

	if (l0 != l1)
	{
		dst[ 0+qRow] = l0;
		dst[ 4+qRow] = l0*0.5f + l1*0.5f;
		dst[ 8+qRow] = l0*0.5f + l1*0.5f;
		dst[12+qRow] = l1;
	}
	else
	{
		dst[ 0+qRow] = l0;
		dst[ 4+qRow] = l0;
		dst[ 8+qRow] = l0;
		dst[12+qRow] = l0;
	}
}